

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O2

string * __thiscall
t_html_generator::escape_html_tags
          (string *__return_storage_ptr__,t_html_generator *this,string *str)

{
  ulong uVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  byte *pbVar5;
  ulong uVar6;
  iterator iVar7;
  ostream *poVar8;
  size_type sVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  string tag_key;
  string tag_content;
  string local_340 [32];
  ostringstream tagstream;
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
  bVar11 = 0x3f;
  uVar10 = 0;
  while (uVar6 = str->_M_string_length, uVar10 < uVar6) {
    for (lVar12 = 0; uVar1 = lVar12 + uVar10, uVar1 < uVar6; lVar12 = lVar12 + 1) {
      pbVar5 = (byte *)std::__cxx11::string::at((ulong)str);
      bVar11 = *pbVar5;
      if ((bVar11 & 0xfd) == 0x3c) break;
      uVar6 = str->_M_string_length;
    }
    if (uVar10 < uVar1) {
      std::__cxx11::string::substr((ulong)&tagstream,(ulong)str);
      std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,
                      (string *)&tagstream);
      std::__cxx11::string::~string((string *)&tagstream);
      uVar10 = uVar1;
    }
    if (str->_M_string_length <= uVar10) break;
    uVar10 = uVar10 + 1;
    if (bVar11 == 0x3e) {
      bVar11 = 0x3e;
      std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,"&gt;");
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tagstream);
      for (; uVar10 < str->_M_string_length; uVar10 = uVar10 + 1) {
        pbVar5 = (byte *)std::__cxx11::string::at((ulong)str);
        bVar11 = *pbVar5;
        if (bVar11 == 0x3c) {
          std::operator<<((ostream *)&tagstream,"&lt;");
        }
        else {
          if (bVar11 == 0x3e) {
            uVar10 = uVar10 + 1;
            break;
          }
          std::operator<<((ostream *)&tagstream,bVar11);
        }
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string((string *)&tag_key,(string *)&tag_content);
      uVar6 = std::__cxx11::string::find_first_of((char *)&tag_key,0x2e5376);
      if (uVar6 != 0xffffffffffffffff) {
        std::__cxx11::string::erase((ulong)&tag_key,uVar6);
      }
      sVar3 = tag_key._M_string_length;
      _Var2._M_p = tag_key._M_dataplus._M_p;
      for (sVar9 = 0; sVar3 != sVar9; sVar9 = sVar9 + 1) {
        iVar4 = tolower((int)_Var2._M_p[sVar9]);
        _Var2._M_p[sVar9] = (char)iVar4;
      }
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&(this->allowed_markup)._M_t,&tag_key);
      if ((_Rb_tree_header *)iVar7._M_node ==
          &(this->allowed_markup)._M_t._M_impl.super__Rb_tree_header) {
        poVar8 = std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,"&lt;");
        std::__cxx11::stringbuf::str();
        poVar8 = std::operator<<(poVar8,local_340);
        std::operator<<(poVar8,"&gt;");
        std::__cxx11::string::~string(local_340);
        pverbose("illegal markup <%s> in doc-comment\n",tag_key._M_dataplus._M_p);
      }
      else {
        poVar8 = std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,"<");
        poVar8 = std::operator<<(poVar8,(string *)&tag_content);
        std::operator<<(poVar8,">");
      }
      std::__cxx11::string::~string((string *)&tag_key);
      std::__cxx11::string::~string((string *)&tag_content);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tagstream);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string t_html_generator::escape_html_tags(std::string const& str) {
  std::ostringstream result;

  unsigned char c = '?';
  size_t lastpos;
  size_t firstpos = 0;
  while (firstpos < str.length()) {

    // look for non-ASCII char
    lastpos = firstpos;
    while (lastpos < str.length()) {
      c = str.at(lastpos);
      if (('<' == c) || ('>' == c)) {
        break;
      }
      ++lastpos;
    }

    // copy what we got so far
    if (lastpos > firstpos) {
      result << str.substr(firstpos, lastpos - firstpos);
      firstpos = lastpos;
    }

    // reached the end?
    if (firstpos >= str.length()) {
      break;
    }

    // tag end without corresponding begin
    ++firstpos;
    if ('>' == c) {
      result << "&gt;";
      continue;
    }

    // extract the tag
    std::ostringstream tagstream;
    while (firstpos < str.length()) {
      c = str.at(firstpos);
      ++firstpos;
      if ('<' == c) {
        tagstream << "&lt;"; // nested begin?
      } else if ('>' == c) {
        break;
      } else {
        tagstream << c; // not very efficient, but tags should be quite short
      }
    }

    // we allow for several markup in docstrings, all else will become escaped
    string tag_content = tagstream.str();
    string tag_key = tag_content;
    size_t first_white = tag_key.find_first_of(" \t\f\v\n\r");
    if (first_white != string::npos) {
      tag_key.erase(first_white);
    }
    for (char & i : tag_key) {
      i = tolower(i);
    }
    if (allowed_markup.find(tag_key) != allowed_markup.end()) {
      result << "<" << tag_content << ">";
    } else {
      result << "&lt;" << tagstream.str() << "&gt;";
      pverbose("illegal markup <%s> in doc-comment\n", tag_key.c_str());
    }
  }

  return result.str();
}